

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

int Gia_ManFindGateGateInt
              (word *pOff,word *pOn,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vUnatePairs,
              Vec_Int_t *vUnatePairsW,word *pDivTempA,word *pDivTempB)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int i;
  int in_stack_ffffffffffffff88;
  
  iVar1 = Abc_TtCountOnesVec(pOn,nWords);
  i = 0;
  do {
    if (vUnatePairs->nSize <= i) {
      return -1;
    }
    iVar2 = Vec_IntEntry(vUnatePairs,i);
    iVar3 = Vec_IntEntry(vUnatePairsW,i);
    uVar4 = Abc_LitIsCompl(iVar2);
    if (iVar3 * 2 < iVar1) {
      return -1;
    }
    Gia_ManDeriveDivPair(iVar2,vDivs,nWords,pDivTempA);
    iVar2 = i;
    while (iVar2 = iVar2 + 1, iVar2 < vUnatePairs->nSize) {
      iVar5 = Vec_IntEntry(vUnatePairs,iVar2);
      iVar6 = Vec_IntEntry(vUnatePairsW,iVar2);
      uVar7 = Abc_LitIsCompl(iVar5);
      if (iVar6 + iVar3 < iVar1) break;
      Gia_ManDeriveDivPair(iVar5,vDivs,nWords,pDivTempB);
      iVar5 = Gia_ManDivCover(pOn,pDivTempA,(word *)(ulong)uVar4,(int)pDivTempB,(word *)(ulong)uVar7
                              ,nWords,in_stack_ffffffffffffff88);
      if (iVar5 != 0) {
        iVar1 = Abc_Var2Lit(iVar2,1);
        uVar4 = Abc_Var2Lit(i,1);
        iVar1 = Abc_Var2Lit(iVar1 << 0xf | uVar4,1);
        return iVar1;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Gia_ManFindGateGateInt( word * pOff, word * pOn, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnatePairs, Vec_Int_t * vUnatePairsW, word * pDivTempA, word * pDivTempB )
{
    int i, k, iDiv0, iDiv1, Cover0, Cover1;
    int nTotal = Abc_TtCountOnesVec( pOn, nWords );
    Vec_IntForEachEntryTwo( vUnatePairs, vUnatePairsW, iDiv0, Cover0, k )
    {
        int fCompA = Abc_LitIsCompl(iDiv0);
        if ( 2*Cover0 < nTotal )
            break;
        Gia_ManDeriveDivPair( iDiv0, vDivs, nWords, pDivTempA );
        Vec_IntForEachEntryTwoStart( vUnatePairs, vUnatePairsW, iDiv1, Cover1, i, k+1 )
        {
            int fCompB = Abc_LitIsCompl(iDiv1);
            if ( Cover0 + Cover1 < nTotal )
                break;
            Gia_ManDeriveDivPair( iDiv1, vDivs, nWords, pDivTempB );
            if ( Gia_ManDivCover(pOff, pOn, pDivTempA, fCompA, pDivTempB, fCompB, nWords) )
                return Abc_Var2Lit((Abc_Var2Lit(i, 1) << 15) | Abc_Var2Lit(k, 1), 1);
        }
    }
    return -1;
}